

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3UnlinkAndDeleteTrigger(sqlite3 *db,int iDb,char *zName)

{
  char cVar1;
  Trigger *pTVar2;
  Trigger **ppTVar3;
  uint uVar4;
  Trigger *pTrigger;
  Table *pTVar5;
  Trigger **ppTVar6;
  char *pcVar7;
  
  if (zName == (char *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0xffffffff;
    pcVar7 = zName;
    do {
      uVar4 = uVar4 + 1;
      cVar1 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar1 != '\0');
    uVar4 = uVar4 & 0x3fffffff;
  }
  pTrigger = (Trigger *)sqlite3HashInsert(&(db->aDb[iDb].pSchema)->trigHash,zName,uVar4,(void *)0x0)
  ;
  if (pTrigger != (Trigger *)0x0) {
    if (pTrigger->pSchema == pTrigger->pTabSchema) {
      pTVar5 = tableOfTrigger(pTrigger);
      ppTVar3 = &pTVar5->pTrigger;
      do {
        ppTVar6 = ppTVar3;
        pTVar2 = *ppTVar6;
        ppTVar3 = &pTVar2->pNext;
      } while (pTVar2 != pTrigger);
      *ppTVar6 = pTVar2->pNext;
    }
    sqlite3DeleteTrigger(db,pTrigger);
    *(byte *)&db->flags = (byte)db->flags | 2;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UnlinkAndDeleteTrigger(sqlite3 *db, int iDb, const char *zName){
  Trigger *pTrigger;
  Hash *pHash;

  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  pHash = &(db->aDb[iDb].pSchema->trigHash);
  pTrigger = sqlite3HashInsert(pHash, zName, sqlite3Strlen30(zName), 0);
  if( ALWAYS(pTrigger) ){
    if( pTrigger->pSchema==pTrigger->pTabSchema ){
      Table *pTab = tableOfTrigger(pTrigger);
      Trigger **pp;
      for(pp=&pTab->pTrigger; *pp!=pTrigger; pp=&((*pp)->pNext));
      *pp = (*pp)->pNext;
    }
    sqlite3DeleteTrigger(db, pTrigger);
    db->flags |= SQLITE_InternChanges;
  }
}